

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_qcache.c
# Opt level: O0

ares_status_t
ares_qcache_fetch(ares_channel_t *channel,ares_timeval_t *now,ares_dns_record_t *dnsrec,
                 ares_dns_record_t **dnsrec_resp)

{
  char *key_00;
  void *pvVar1;
  ares_status_t local_44;
  ares_status_t status;
  ares_qcache_entry_t *entry;
  char *key;
  ares_dns_record_t **dnsrec_resp_local;
  ares_dns_record_t *dnsrec_local;
  ares_timeval_t *now_local;
  ares_channel_t *channel_local;
  
  local_44 = ARES_SUCCESS;
  if (((channel == (ares_channel_t *)0x0) || (dnsrec == (ares_dns_record_t *)0x0)) ||
     (dnsrec_resp == (ares_dns_record_t **)0x0)) {
    channel_local._4_4_ = ARES_EFORMERR;
  }
  else if (channel->qcache == (ares_qcache_t *)0x0) {
    channel_local._4_4_ = ARES_ENOTFOUND;
  }
  else {
    ares_qcache_expire(channel->qcache,now);
    key_00 = ares_qcache_calc_key(dnsrec);
    if (key_00 == (char *)0x0) {
      local_44 = ARES_ENOMEM;
    }
    else {
      pvVar1 = ares_htable_strvp_get_direct(channel->qcache->cache,key_00);
      if (pvVar1 == (void *)0x0) {
        local_44 = ARES_ENOTFOUND;
      }
      else {
        ares_dns_record_ttl_decrement
                  (*(ares_dns_record_t **)((long)pvVar1 + 8),
                   (int)now->sec - (int)*(undefined8 *)((long)pvVar1 + 0x18));
        *dnsrec_resp = *(ares_dns_record_t **)((long)pvVar1 + 8);
      }
    }
    ares_free(key_00);
    channel_local._4_4_ = local_44;
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_qcache_fetch(ares_channel_t           *channel,
                                const ares_timeval_t     *now,
                                const ares_dns_record_t  *dnsrec,
                                const ares_dns_record_t **dnsrec_resp)
{
  char                *key = NULL;
  ares_qcache_entry_t *entry;
  ares_status_t        status = ARES_SUCCESS;

  if (channel == NULL || dnsrec == NULL || dnsrec_resp == NULL) {
    return ARES_EFORMERR;
  }

  if (channel->qcache == NULL) {
    return ARES_ENOTFOUND;
  }

  ares_qcache_expire(channel->qcache, now);

  key = ares_qcache_calc_key(dnsrec);
  if (key == NULL) {
    status = ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
    goto done;            /* LCOV_EXCL_LINE: OutOfMemory */
  }

  entry = ares_htable_strvp_get_direct(channel->qcache->cache, key);
  if (entry == NULL) {
    status = ARES_ENOTFOUND;
    goto done;
  }

  ares_dns_record_ttl_decrement(entry->dnsrec,
                                (unsigned int)(now->sec - entry->insert_ts));

  *dnsrec_resp = entry->dnsrec;

done:
  ares_free(key);
  return status;
}